

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.h
# Opt level: O0

iterator * __thiscall
idx2::IncreaseCapacity<short,idx2::bitstream>
          (iterator *__return_storage_ptr__,idx2 *this,hash_table<short,_idx2::bitstream> *Ht,
          iterator *ItIn)

{
  hash_table<short,_idx2::bitstream> *Ht_00;
  hash_table<short,_idx2::bitstream> *extraout_RDX;
  hash_table<short,_idx2::bitstream> *Ht_01;
  bitstream *in_R8;
  undefined1 local_c0 [8];
  iterator Result;
  bitstream *local_90;
  hash_table<short,_idx2::bitstream> *local_88;
  undefined1 local_80 [8];
  iterator It;
  hash_table<short,_idx2::bitstream> NewHt;
  iterator *ItIn_local;
  hash_table<short,_idx2::bitstream> *Ht_local;
  
  __return_storage_ptr__->Key = Ht->Keys;
  __return_storage_ptr__->Val = Ht->Vals;
  __return_storage_ptr__->Ht = (hash_table<short,_idx2::bitstream> *)Ht->Stats;
  __return_storage_ptr__->Idx = Ht->Size;
  hash_table<short,_idx2::bitstream>::hash_table((hash_table<short,_idx2::bitstream> *)&It.Idx);
  Init<short,idx2::bitstream>
            ((hash_table<short,_idx2::bitstream> *)&It.Idx,*(long *)(this + 0x20) + 1,
             *(allocator **)(this + 0x28));
  Begin<short,idx2::bitstream>((iterator *)local_80,this,Ht_00);
  Ht_01 = extraout_RDX;
  while (End<short,idx2::bitstream>((iterator *)&Result.Idx,this,Ht_01),
        It.Val != local_90 || It.Ht != local_88) {
    Insert<short,idx2::bitstream>
              ((iterator *)local_c0,(idx2 *)&It.Idx,(hash_table<short,_idx2::bitstream> *)local_80,
               It.Key,in_R8);
    if (*Ht->Keys == *(short *)local_c0) {
      __return_storage_ptr__->Key = (short *)local_c0;
      __return_storage_ptr__->Val = (bitstream *)Result.Key;
      __return_storage_ptr__->Ht = (hash_table<short,_idx2::bitstream> *)Result.Val;
      __return_storage_ptr__->Idx = (i64)Result.Ht;
    }
    do {
      It.Ht = (hash_table<short,_idx2::bitstream> *)((long)&(It.Ht)->Keys + 1);
    } while (*(char *)((long)&(It.Ht)->Keys + (long)&(((It.Val)->Stream).Alloc)->_vptr_allocator) !=
             '\x02');
    local_80 = (undefined1  [8])(((It.Val)->Stream).Data + (long)It.Ht * 2);
    Ht_01 = (hash_table<short,_idx2::bitstream> *)((long)It.Ht * 0x30);
    It.Key = (short *)((long)&Ht_01->Keys + ((It.Val)->Stream).Bytes);
  }
  Dealloc<short,idx2::bitstream>((hash_table<short,_idx2::bitstream> *)this);
  memcpy(this,&It.Idx,0x30);
  __return_storage_ptr__->Ht = (hash_table<short,_idx2::bitstream> *)this;
  return __return_storage_ptr__;
}

Assistant:

typename hash_table<k, v>::iterator
IncreaseCapacity(hash_table<k, v>* Ht, const typename hash_table<k, v>::iterator& ItIn)
{
  auto ItOut = ItIn;
  hash_table<k, v> NewHt;
  Init(&NewHt, Ht->LogCapacity + 1, Ht->Alloc);
  for (auto It = Begin(*Ht); It != End(*Ht); ++It)
  {
    auto Result = Insert(&NewHt, *(It.Key), *(It.Val));
    if (*(ItIn.Key) == *(Result.Key))
      ItOut = Result;
  }
  Dealloc(Ht);
  *Ht = NewHt;
  ItOut.Ht = Ht;
  return ItOut;
}